

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1da1d1::FunctionParam::printLeft(FunctionParam *this,OutputStream *S)

{
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  FunctionParam *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  StringView::StringView(&local_28,"fp");
  OutputStream::operator+=(local_18,local_28);
  OutputStream::operator+=(local_18,this->Number);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "fp";
    S += Number;
  }